

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handler.c
# Opt level: O3

void affect_strip(CHAR_DATA *ch,int sn)

{
  AFFECT_DATA *pAVar1;
  AFFECT_DATA *paf;
  
  pAVar1 = ch->affected;
  while (paf = pAVar1, paf != (AFFECT_DATA *)0x0) {
    pAVar1 = paf->next;
    if (paf->type == sn) {
      affect_remove(ch,paf);
    }
  }
  return;
}

Assistant:

void affect_strip(CHAR_DATA *ch, int sn)
{
	AFFECT_DATA *paf;
	AFFECT_DATA *paf_next;

	for (paf = ch->affected; paf != nullptr; paf = paf_next)
	{
		paf_next = paf->next;

		if (paf->type == sn)
		{
			affect_remove(ch, paf);
		}
	}
}